

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSVIWriterHandlers.cpp
# Opt level: O0

void __thiscall
PSVIWriterHandlers::processSchemaComponents(PSVIWriterHandlers *this,XSNamespaceItem *namespaceItem)

{
  XSNamedMap<xercesc_4_0::XSTypeDefinition> *this_00;
  XSNamedMap<xercesc_4_0::XSAttributeDeclaration> *pXVar1;
  XSTypeDefinition *type;
  XSNamedMap<xercesc_4_0::XSElementDeclaration> *pXVar2;
  XSAttributeDeclaration *attribute;
  XSNamedMap<xercesc_4_0::XSAttributeGroupDefinition> *pXVar3;
  XSElementDeclaration *element;
  XSNamedMap<xercesc_4_0::XSModelGroupDefinition> *pXVar4;
  XSAttributeGroupDefinition *attributeGroup;
  XSNamedMap<xercesc_4_0::XSNotationDeclaration> *pXVar5;
  XSModelGroupDefinition *modelGroup;
  XMLSize_t XVar6;
  XSNotationDeclaration *notation;
  COMPONENT_TYPE CVar7;
  ulong local_78;
  XMLSize_t notationCount;
  XSNamedMap<xercesc_4_0::XSNotationDeclaration> *notations;
  XMLSize_t modelGroupCount;
  XSNamedMap<xercesc_4_0::XSModelGroupDefinition> *modelGroups;
  XMLSize_t attrGroupCount;
  XSNamedMap<xercesc_4_0::XSAttributeGroupDefinition> *attrGroups;
  XMLSize_t elemCount;
  XSNamedMap<xercesc_4_0::XSElementDeclaration> *elements;
  XMLSize_t attrCount;
  XSNamedMap<xercesc_4_0::XSAttributeDeclaration> *attributes;
  XMLSize_t typeCount;
  XSNamedMap<xercesc_4_0::XSTypeDefinition> *types;
  XSNamespaceItem *namespaceItem_local;
  PSVIWriterHandlers *this_local;
  
  sendIndentedElement(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgSchemaComponents);
  CVar7 = (COMPONENT_TYPE)namespaceItem;
  this_00 = (XSNamedMap<xercesc_4_0::XSTypeDefinition> *)
            xercesc_4_0::XSNamespaceItem::getComponents(CVar7);
  attributes = (XSNamedMap<xercesc_4_0::XSAttributeDeclaration> *)0x0;
  while( true ) {
    pXVar1 = (XSNamedMap<xercesc_4_0::XSAttributeDeclaration> *)
             xercesc_4_0::XSNamedMap<xercesc_4_0::XSTypeDefinition>::getLength(this_00);
    if (pXVar1 <= attributes) break;
    type = xercesc_4_0::XSNamedMap<xercesc_4_0::XSTypeDefinition>::item
                     (this_00,(XMLSize_t)attributes);
    processTypeDefinition(this,type);
    attributes = attributes + 1;
  }
  pXVar1 = (XSNamedMap<xercesc_4_0::XSAttributeDeclaration> *)
           xercesc_4_0::XSNamespaceItem::getComponents(CVar7);
  elements = (XSNamedMap<xercesc_4_0::XSElementDeclaration> *)0x0;
  while( true ) {
    pXVar2 = (XSNamedMap<xercesc_4_0::XSElementDeclaration> *)
             xercesc_4_0::XSNamedMap<xercesc_4_0::XSAttributeDeclaration>::getLength(pXVar1);
    if (pXVar2 <= elements) break;
    attribute = xercesc_4_0::XSNamedMap<xercesc_4_0::XSAttributeDeclaration>::item
                          (pXVar1,(XMLSize_t)elements);
    processAttributeDeclaration(this,attribute);
    elements = elements + 1;
  }
  pXVar2 = (XSNamedMap<xercesc_4_0::XSElementDeclaration> *)
           xercesc_4_0::XSNamespaceItem::getComponents(CVar7);
  attrGroups = (XSNamedMap<xercesc_4_0::XSAttributeGroupDefinition> *)0x0;
  while( true ) {
    pXVar3 = (XSNamedMap<xercesc_4_0::XSAttributeGroupDefinition> *)
             xercesc_4_0::XSNamedMap<xercesc_4_0::XSElementDeclaration>::getLength(pXVar2);
    if (pXVar3 <= attrGroups) break;
    element = xercesc_4_0::XSNamedMap<xercesc_4_0::XSElementDeclaration>::item
                        (pXVar2,(XMLSize_t)attrGroups);
    processElementDeclaration(this,element);
    attrGroups = attrGroups + 1;
  }
  pXVar3 = (XSNamedMap<xercesc_4_0::XSAttributeGroupDefinition> *)
           xercesc_4_0::XSNamespaceItem::getComponents(CVar7);
  modelGroups = (XSNamedMap<xercesc_4_0::XSModelGroupDefinition> *)0x0;
  while( true ) {
    pXVar4 = (XSNamedMap<xercesc_4_0::XSModelGroupDefinition> *)
             xercesc_4_0::XSNamedMap<xercesc_4_0::XSAttributeGroupDefinition>::getLength(pXVar3);
    if (pXVar4 <= modelGroups) break;
    attributeGroup =
         xercesc_4_0::XSNamedMap<xercesc_4_0::XSAttributeGroupDefinition>::item
                   (pXVar3,(XMLSize_t)modelGroups);
    processAttributeGroupDefinition(this,attributeGroup);
    modelGroups = modelGroups + 1;
  }
  pXVar4 = (XSNamedMap<xercesc_4_0::XSModelGroupDefinition> *)
           xercesc_4_0::XSNamespaceItem::getComponents(CVar7);
  notations = (XSNamedMap<xercesc_4_0::XSNotationDeclaration> *)0x0;
  while( true ) {
    pXVar5 = (XSNamedMap<xercesc_4_0::XSNotationDeclaration> *)
             xercesc_4_0::XSNamedMap<xercesc_4_0::XSModelGroupDefinition>::getLength(pXVar4);
    if (pXVar5 <= notations) break;
    modelGroup = xercesc_4_0::XSNamedMap<xercesc_4_0::XSModelGroupDefinition>::item
                           (pXVar4,(XMLSize_t)notations);
    processModelGroupDefinition(this,modelGroup);
    notations = notations + 1;
  }
  pXVar5 = (XSNamedMap<xercesc_4_0::XSNotationDeclaration> *)
           xercesc_4_0::XSNamespaceItem::getComponents(CVar7);
  local_78 = 0;
  while( true ) {
    XVar6 = xercesc_4_0::XSNamedMap<xercesc_4_0::XSNotationDeclaration>::getLength(pXVar5);
    if (XVar6 <= local_78) break;
    notation = xercesc_4_0::XSNamedMap<xercesc_4_0::XSNotationDeclaration>::item(pXVar5,local_78);
    processNotationDeclaration(this,notation);
    local_78 = local_78 + 1;
  }
  sendUnindentedElement(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgSchemaComponents);
  return;
}

Assistant:

void PSVIWriterHandlers::processSchemaComponents(XSNamespaceItem* namespaceItem) {
	sendIndentedElement(PSVIUni::fgSchemaComponents);
	XSNamedMap<XSTypeDefinition>* types = (XSNamedMap<XSTypeDefinition>*)(namespaceItem->getComponents(XSConstants::TYPE_DEFINITION));
	for (XMLSize_t typeCount = 0; typeCount < types->getLength(); typeCount++) {
		processTypeDefinition(types->item(typeCount));
	}
	XSNamedMap<XSAttributeDeclaration>* attributes = (XSNamedMap<XSAttributeDeclaration>*)namespaceItem->getComponents(XSConstants::ATTRIBUTE_DECLARATION);
	for (XMLSize_t attrCount = 0; attrCount < attributes->getLength(); attrCount++) {
		processAttributeDeclaration(attributes->item(attrCount));
	}
	XSNamedMap<XSElementDeclaration>* elements = (XSNamedMap<XSElementDeclaration>*)namespaceItem->getComponents(XSConstants::ELEMENT_DECLARATION);
	for (XMLSize_t elemCount = 0; elemCount < elements->getLength(); elemCount++) {
		processElementDeclaration(elements->item(elemCount));
	}
	XSNamedMap<XSAttributeGroupDefinition>* attrGroups = (XSNamedMap<XSAttributeGroupDefinition>*)namespaceItem->getComponents(XSConstants::ATTRIBUTE_GROUP_DEFINITION);
	for (XMLSize_t attrGroupCount = 0; attrGroupCount < attrGroups->getLength(); attrGroupCount++) {
		processAttributeGroupDefinition(attrGroups->item(attrGroupCount));
	}
	XSNamedMap<XSModelGroupDefinition>* modelGroups = (XSNamedMap<XSModelGroupDefinition>*)namespaceItem->getComponents(XSConstants::MODEL_GROUP_DEFINITION);
	for (XMLSize_t modelGroupCount = 0; modelGroupCount < modelGroups->getLength(); modelGroupCount++) {
		processModelGroupDefinition(modelGroups->item(modelGroupCount));
	}
	XSNamedMap<XSNotationDeclaration>* notations = (XSNamedMap<XSNotationDeclaration>*)namespaceItem->getComponents(XSConstants::NOTATION_DECLARATION);
	for (XMLSize_t notationCount = 0; notationCount < notations->getLength(); notationCount++) {
		processNotationDeclaration(notations->item(notationCount));
	}
	sendUnindentedElement(PSVIUni::fgSchemaComponents);
}